

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring.hxx
# Opt level: O3

void __thiscall Ring<double>::next(Ring<double> *this,double d)

{
  uint uVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = this->ringSize;
  if ((this->ringDelayedAdd != 0.0) || (NAN(this->ringDelayedAdd))) {
    if (0 < (int)uVar1) {
      pdVar2 = this->ringData;
      uVar4 = 0;
      do {
        pdVar2[uVar4] = this->ringDelayedAdd + pdVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    this->ringDelayedAdd = 0.0;
  }
  this->ringCacheInvalid = true;
  iVar3 = this->ringCurrentIndex + 1;
  this->ringCurrentIndex = iVar3;
  if ((int)uVar1 <= iVar3) {
    this->ringCurrentIndex = 0;
    this->ringIsInitialised = true;
    iVar3 = 0;
  }
  this->ringData[iVar3] = d;
  return;
}

Assistant:

void flush() const {
        if (ringDelayedAdd != 0.0) {
            for(int i=0; i<ringSize; i++) {
                ringData[i] += ringDelayedAdd;
            }
            ringDelayedAdd = 0.0;
        }
    }